

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.c
# Opt level: O0

void Uint64ToByteArray(UINT64 i,BYTE *a)

{
  BYTE *a_local;
  UINT64 i_local;
  
  a[7] = (BYTE)i;
  a[6] = (BYTE)(i >> 8);
  a[5] = (BYTE)(i >> 0x10);
  a[4] = (BYTE)(i >> 0x18);
  a[3] = (BYTE)(i >> 0x20);
  a[2] = (BYTE)(i >> 0x28);
  a[1] = (BYTE)(i >> 0x30);
  *a = (BYTE)(i >> 0x38);
  return;
}

Assistant:

void
Uint64ToByteArray(
    UINT64               i,
    BYTE                *a
    )
{
    a[7] = (BYTE)(i); i >>= 8;
    a[6] = (BYTE)(i); i >>= 8;
    a[5] = (BYTE)(i); i >>= 8;
    a[4] = (BYTE)(i); i >>= 8;
    a[3] = (BYTE)(i); i >>= 8;
    a[2] = (BYTE)(i); i >>= 8;
    a[1] = (BYTE)(i); i >>= 8;
    a[0] = (BYTE)(i);
}